

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O0

void __thiscall Promise::Promise(Promise *this,ManuallyResolvedHandler *in_handler)

{
  EVP_PKEY_CTX *ctx;
  ManuallyResolvedHandler *in_handler_local;
  Promise *this_local;
  
  std::enable_shared_from_this<Promise>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Promise>);
  this->_vptr_Promise = (_func_int **)&PTR_Tick_00117c50;
  std::function<void_(std::shared_ptr<Promise>)>::function
            (&this->manually_resolved_handler,in_handler);
  ctx = (EVP_PKEY_CTX *)0x0;
  std::function<void_()>::function(&this->auto_resolved_handler,(nullptr_t)0x0);
  this->handler_ran = false;
  this->state = Pending;
  this->data = (void *)0x0;
  this->passed_value = (void *)0x0;
  std::shared_ptr<Promise>::shared_ptr(&this->parent);
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::vector
            (&this->children);
  this->id = 0;
  this->is_registered = false;
  printf("ManuallyResolvedHandler ");
  _init(this,ctx);
  return;
}

Assistant:

explicit Promise(ManuallyResolvedHandler in_handler): manually_resolved_handler(std::move(in_handler)) {
    printf("ManuallyResolvedHandler ");
    _init();
  }